

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall gmlc::networking::TcpServer::initialConnect(TcpServer *this)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  string *psVar4;
  element_type *in_RCX;
  sockaddr *__addr;
  int iVar5;
  long in_RDI;
  shared_ptr<gmlc::networking::TcpAcceptor> *acc_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *__range2_1;
  int index;
  size_t connectedAcceptors;
  bool anyConnect;
  pointer acc;
  basic_endpoint<asio::ip::tcp> *ep;
  iterator __end2;
  iterator __begin2;
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  *__range2;
  function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
  *in_stack_fffffffffffffcd8;
  TcpAcceptor *in_stack_fffffffffffffce0;
  string *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  TcpServer *in_stack_fffffffffffffcf0;
  element_type *in_stack_fffffffffffffd00;
  io_context *in_stack_fffffffffffffd08;
  element_type *in_stack_fffffffffffffd10;
  element_type *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_289 [168];
  allocator<char> local_1e1 [104];
  undefined1 local_179 [153];
  long local_e0;
  int local_d4;
  string *local_d0;
  undefined1 local_c1;
  io_context local_98 [2];
  boolean<1,_2> local_78;
  boolean<1,_2> local_74 [5];
  reference local_60;
  basic_endpoint<asio::ip::tcp> *local_58;
  __normal_iterator<asio::ip::basic_endpoint<asio::ip::tcp>_*,_std::vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>_>
  local_50;
  long local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29;
  
  bVar1 = CLI::std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_fffffffffffffce8,
                     (memory_order)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  if (bVar1) {
    this_00 = &local_29;
    std::allocator<char>::allocator();
    iVar5 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffd18,
               (allocator<char> *)in_stack_fffffffffffffd10);
    logger(in_stack_fffffffffffffcf0,iVar5,(string *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffce0);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    local_48 = in_RDI + 0x70;
    local_50._M_current =
         (basic_endpoint<asio::ip::tcp> *)
         std::
         vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
         ::begin((vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                  *)in_stack_fffffffffffffcd8);
    local_58 = (basic_endpoint<asio::ip::tcp> *)
               std::
               vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
               ::end((vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                      *)in_stack_fffffffffffffcd8);
    while (bVar1 = __gnu_cxx::
                   operator==<asio::ip::basic_endpoint<asio::ip::tcp>_*,_std::vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>_>
                             ((__normal_iterator<asio::ip::basic_endpoint<asio::ip::tcp>_*,_std::vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>_>
                               *)in_stack_fffffffffffffce0,
                              (__normal_iterator<asio::ip::basic_endpoint<asio::ip::tcp>_*,_std::vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>_>
                               *)in_stack_fffffffffffffcd8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_60 = __gnu_cxx::
                 __normal_iterator<asio::ip::basic_endpoint<asio::ip::tcp>_*,_std::vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>_>
                 ::operator*(&local_50);
      TcpAcceptor::create(in_stack_fffffffffffffd08,(endpoint *)in_stack_fffffffffffffd00);
      if ((*(byte *)(in_RDI + 0xf1) & 1) == 0) {
        in_stack_fffffffffffffd10 =
             std::
             __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7ccc02);
        ::asio::detail::socket_option::boolean<1,_2>::boolean(&local_78,false);
        TcpAcceptor::set_option<asio::detail::socket_option::boolean<1,2>>
                  (in_stack_fffffffffffffce0,(boolean<1,_2> *)in_stack_fffffffffffffcd8);
      }
      else {
        in_stack_fffffffffffffd18 =
             std::
             __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7ccbad);
        ::asio::detail::socket_option::boolean<1,_2>::boolean(local_74,true);
        TcpAcceptor::set_option<asio::detail::socket_option::boolean<1,2>>
                  (in_stack_fffffffffffffce0,(boolean<1,_2> *)in_stack_fffffffffffffcd8);
      }
      in_RCX = std::
               __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x7ccc3b);
      in_stack_fffffffffffffd08 = local_98;
      in_stack_fffffffffffffd00 = in_RCX;
      std::
      function<void(std::shared_ptr<gmlc::networking::TcpAcceptor>,std::shared_ptr<gmlc::networking::TcpConnection>)>
      ::function<gmlc::networking::TcpServer::initialConnect()::__0,void>
                ((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                  *)in_stack_fffffffffffffcf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffce8);
      TcpAcceptor::setAcceptCall(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      std::
      function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
      ::~function((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                   *)0x7ccc88);
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)0x7ccc99);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x7cccaf);
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)in_stack_fffffffffffffcf0,
                   (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)in_stack_fffffffffffffce8);
        TcpAcceptor::setLoggingFunction
                  (in_stack_fffffffffffffd00,
                   (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)peVar3);
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)0x7cccf0);
      }
      std::
      vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
      ::push_back((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                   *)in_stack_fffffffffffffce0,(value_type *)in_stack_fffffffffffffcd8);
      std::shared_ptr<gmlc::networking::TcpAcceptor>::~shared_ptr
                ((shared_ptr<gmlc::networking::TcpAcceptor> *)0x7ccd5d);
      __gnu_cxx::
      __normal_iterator<asio::ip::basic_endpoint<asio::ip::tcp>_*,_std::vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>_>
      ::operator++(&local_50);
    }
    local_c1 = 0;
    local_d0 = (string *)0x0;
    local_d4 = 0;
    local_e0 = in_RDI + 0x58;
    local_179._145_8_ =
         std::
         vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
         ::begin((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                  *)in_stack_fffffffffffffcd8);
    local_179._137_8_ =
         std::
         vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
         ::end((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                *)in_stack_fffffffffffffcd8);
    while( true ) {
      iVar5 = (int)local_179 + 0x89;
      bVar1 = __gnu_cxx::
              operator==<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                        ((__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                          *)in_stack_fffffffffffffce0,
                         (__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                          *)in_stack_fffffffffffffcd8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_179._129_8_ =
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
           ::operator*((__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                        *)(local_179 + 0x91));
      local_d4 = local_d4 + 1;
      peVar3 = std::
               __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x7cce2e);
      uVar2 = TcpAcceptor::connect(peVar3,iVar5,__addr,(socklen_t)in_RCX);
      if ((uVar2 & 1) == 0) {
        in_stack_fffffffffffffcf0 = (TcpServer *)local_179;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                   (allocator<char> *)in_stack_fffffffffffffd10);
        CLI::std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd10);
        std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
        std::
        vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
        ::size((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                *)(in_RDI + 0x58));
        CLI::std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd18);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd10);
        logger(in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
               (string *)in_stack_fffffffffffffce0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
        std::allocator<char>::~allocator((allocator<char> *)local_179);
      }
      else {
        local_d0 = (string *)((long)&(local_d0->_M_dataplus)._M_p + 1);
        local_c1 = 1;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                    *)(local_179 + 0x91));
    }
    if ((local_c1 & 1) == 0) {
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_fffffffffffffce0,
                 SUB81((ulong)in_stack_fffffffffffffcd8 >> 0x38,0));
      iVar5 = (int)((ulong)local_1e1 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                 (allocator<char> *)in_stack_fffffffffffffd10);
      logger(in_stack_fffffffffffffcf0,iVar5,(string *)in_stack_fffffffffffffce0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce0);
      std::allocator<char>::~allocator(local_1e1);
    }
    else {
      message = local_d0;
      psVar4 = (string *)
               std::
               vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
               ::size((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                       *)(in_RDI + 0x58));
      if (message < psVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                   (allocator<char> *)in_stack_fffffffffffffd10);
        CLI::std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd18);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd10);
        std::operator+(in_stack_fffffffffffffce8,(char *)message);
        std::
        vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
        ::size((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                *)(in_RDI + 0x58));
        CLI::std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd18);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd10);
        std::operator+(in_stack_fffffffffffffce8,(char *)message);
        logger(in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20),message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message);
        std::allocator<char>::~allocator(local_289);
      }
    }
  }
  return;
}

Assistant:

void TcpServer::initialConnect()
{
    if (halted.load(std::memory_order_acquire)) {
        logger(0, "previously halted server");
        return;
    }
    for (auto& ep : endpoints) {
        auto acc = TcpAcceptor::create(ioctx, ep);
        if (reuse_address) {
            acc->set_option(tcp::acceptor::reuse_address(true));
        } else {
            acc->set_option(tcp::acceptor::reuse_address(false));
        }
        acc->setAcceptCall(
            [this](TcpAcceptor::pointer accPtr, TcpConnection::pointer conn) {
                handle_accept(std::move(accPtr), std::move(conn));
            });
        if (logFunction) {
            acc->setLoggingFunction(logFunction);
        }
        acceptors.push_back(std::move(acc));
    }
    bool anyConnect = false;
    size_t connectedAcceptors = 0;
    int index = 0;
    for (auto& acc : acceptors) {
        ++index;
        if (!acc->connect()) {
            logger(
                0,
                std::string("unable to connect acceptor ") +
                    std::to_string(index) + " of " +
                    std::to_string(acceptors.size()));
            continue;
        }
        ++connectedAcceptors;
        anyConnect = true;
    }
    if (!anyConnect) {
        halted = true;
        logger(1, "halting server operation");
        return;
    }
    if (connectedAcceptors < acceptors.size()) {
        logger(
            1,
            std::string("partial connection on the server ") +
                std::to_string(connectedAcceptors) + " of " +
                std::to_string(acceptors.size()) + " were connected");
    }
}